

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
ShellPathNode::Evaluate
          (string *__return_storage_ptr__,ShellPathNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar1;
  const_reference pvVar2;
  cmState *this_00;
  size_type __n;
  string_view source;
  pointer local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  string_view local_258;
  string_view local_248;
  string_view local_238;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  reference local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listOut;
  char *separator;
  cmOutputConverter converter;
  cmStateSnapshot snapshot;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  cmList listIn;
  cmGeneratorExpressionDAGChecker *param_4_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  ShellPathNode *this_local;
  
  local_88 = &local_80;
  listIn.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)param_4;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::front(parameters);
  std::__cxx11::string::string((string *)&local_80,(string *)pvVar2);
  local_60 = &local_80;
  local_58 = 1;
  init._M_len = 1;
  init._M_array = local_60;
  cmList::cmList((cmList *)local_50,init);
  local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
  do {
    local_278 = local_278 + -1;
    std::__cxx11::string::~string((string *)local_278);
  } while (local_278 != &local_80);
  bVar1 = cmList::empty((cmList *)local_50);
  if (bVar1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b8,content);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"\"\" is not an absolute path.",
               (allocator<char> *)((long)&snapshot.Position.Position + 7));
    reportError(context,&local_b8,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&snapshot.Position.Position + 7));
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    snapshot.Position.Position._0_4_ = 1;
  }
  else {
    cmLocalGenerator::GetStateSnapshot
              ((cmStateSnapshot *)&converter.RelativePathTopRelation,context->LG);
    cmOutputConverter::cmOutputConverter
              ((cmOutputConverter *)&separator,(cmStateSnapshot *)&converter.RelativePathTopRelation
              );
    this_00 = cmStateSnapshot::GetState((cmStateSnapshot *)&converter.RelativePathTopRelation);
    bVar1 = cmState::UseWindowsShell(this_00);
    if (bVar1) {
      local_2d8 = (pointer)0x110981e;
    }
    else {
      local_2d8 = (pointer)0x114eef8;
    }
    listOut.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_2d8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1);
    __n = cmList::size((cmList *)local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1,__n);
    __end1 = cmList::begin_abi_cxx11_((cmList *)local_50);
    in = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         cmList::end_abi_cxx11_((cmList *)local_50);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&in);
      if (!bVar1) break;
      local_1a8 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
      bVar1 = cmsys::SystemTools::FileIsFullPath(local_1a8);
      if (!bVar1) {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1c8,content);
        std::operator+(&local_208,"\"",local_1a8);
        std::operator+(&local_1e8,&local_208,"\" is not an absolute path.");
        reportError(context,&local_1c8,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        goto LAB_009bc6f9;
      }
      source = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1a8);
      local_238 = source;
      cmOutputConverter::ConvertDirectorySeparatorsForShell_abi_cxx11_
                (&local_228,(cmOutputConverter *)&separator,source);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range1,
                 &local_228);
      std::__cxx11::string::~string((string *)&local_228);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_248,
               (char *)listOut.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_258);
    cmJoin(__return_storage_ptr__,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1,local_248,local_258);
LAB_009bc6f9:
    snapshot.Position.Position._0_4_ = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
    cmOutputConverter::~cmOutputConverter((cmOutputConverter *)&separator);
  }
  cmList::~cmList((cmList *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    cmList listIn{ parameters.front() };
    if (listIn.empty()) {
      reportError(context, content->GetOriginalExpression(),
                  "\"\" is not an absolute path.");
      return std::string();
    }
    cmStateSnapshot snapshot = context->LG->GetStateSnapshot();
    cmOutputConverter converter(snapshot);
    const char* separator = snapshot.GetState()->UseWindowsShell() ? ";" : ":";
    std::vector<std::string> listOut;
    listOut.reserve(listIn.size());
    for (auto const& in : listIn) {
      if (!cmSystemTools::FileIsFullPath(in)) {
        reportError(context, content->GetOriginalExpression(),
                    "\"" + in + "\" is not an absolute path.");
        return std::string();
      }
      listOut.emplace_back(converter.ConvertDirectorySeparatorsForShell(in));
    }
    return cmJoin(listOut, separator);
  }